

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  string *s;
  DescriptorProto_ExtensionRange *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar3;
  MessageOptions *msg_03;
  DescriptorProto_ReservedRange *msg_04;
  UnknownFieldSet *unknown;
  char cVar4;
  ulong tag_00;
  uint local_3c;
  char *pcStack_38;
  uint32 tag;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pcStack_38 = ptr;
LAB_002cacda:
  do {
    bVar2 = internal::ParseContext::Done(ctx,&stack0xffffffffffffffc8);
    if (bVar2) {
      return pcStack_38;
    }
    pcStack_38 = internal::ReadTag(pcStack_38,&local_3c,0);
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
    tag_00 = (ulong)local_3c;
    cVar4 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar4 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(this);
      pcStack_38 = internal::InlineGreedyStringParser(s,pcStack_38,ctx);
      internal::VerifyUTF8(s,"google.protobuf.DescriptorProto.name");
      goto joined_r0x002cad6c;
    case 2:
      if (cVar4 == '\x12') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          pFVar3 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->field_);
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                                 (ctx,pFVar3,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*pcStack_38 == '\x12'));
        goto LAB_002cacda;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&this->nested_type_);
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                                 (ctx,msg_00,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*pcStack_38 == '\x1a'));
        goto LAB_002cacda;
      }
      break;
    case 4:
      if (cVar4 == '\"') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg_01 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&this->enum_type_);
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                                 (ctx,msg_01,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == '\"'))
        ;
        goto LAB_002cacda;
      }
      break;
    case 5:
      if (cVar4 == '*') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                          (&this->extension_range_);
          pcStack_38 = internal::ParseContext::
                       ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                                 (ctx,msg,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == '*'));
        goto LAB_002cacda;
      }
      break;
    case 6:
      if (cVar4 == '2') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          pFVar3 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->extension_);
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                                 (ctx,pFVar3,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == '2'));
        goto LAB_002cacda;
      }
      break;
    case 7:
      if (cVar4 == ':') {
        msg_03 = _internal_mutable_options(this);
        pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                               (ctx,msg_03,pcStack_38);
        goto joined_r0x002cad6c;
      }
      break;
    case 8:
      if (cVar4 == 'B') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg_02 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(&this->oneof_decl_)
          ;
          pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::OneofDescriptorProto>
                                 (ctx,msg_02,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == 'B'));
        goto LAB_002cacda;
      }
      break;
    case 9:
      if (cVar4 == 'J') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          msg_04 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add
                             (&this->reserved_range_);
          pcStack_38 = internal::ParseContext::
                       ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                                 (ctx,msg_04,pcStack_38);
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == 'J'));
        goto LAB_002cacda;
      }
      break;
    case 10:
      if (cVar4 == 'R') {
        pcStack_38 = pcStack_38 + -1;
        do {
          pcStack_38 = pcStack_38 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(&this->reserved_name_);
          pcStack_38 = internal::InlineGreedyStringParser(s_00,pcStack_38,ctx);
          internal::VerifyUTF8(s_00,"google.protobuf.DescriptorProto.reserved_name");
          if (pcStack_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((pcStack_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pcStack_38 == 'R'));
        goto LAB_002cacda;
      }
    }
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return pcStack_38;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    pcStack_38 = internal::UnknownFieldParse(tag_00,unknown,pcStack_38,ctx);
joined_r0x002cad6c:
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_reserved_name();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.reserved_name");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}